

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtSat.c
# Opt level: O3

int Cgt_CheckImplication(Cgt_Man_t *p,Aig_Obj_t *pGate,Aig_Obj_t *pMiter)

{
  int *piVar1;
  sat_solver *s;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  timespec ts;
  timespec local_40;
  undefined8 local_30;
  
  iVar3 = p->pPars->nConfMax;
  p->nCalls = p->nCalls + 1;
  if ((p->pSat == (sat_solver *)0x0) || (p->pCnf == (Cnf_Dat_t *)0x0)) {
    __assert_fail("p->pSat && p->pCnf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cgt/cgtSat.c"
                  ,0x36,"int Cgt_CheckImplication(Cgt_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (((ulong)pMiter & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pMiter)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cgt/cgtSat.c"
                  ,0x37,"int Cgt_CheckImplication(Cgt_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if ((Aig_Obj_t *)((ulong)pGate & 0xfffffffffffffffe) != pMiter) {
    piVar1 = p->pCnf->pVarNums;
    local_30 = CONCAT44(piVar1[pMiter->Id] * 2,
                        ((uint)pGate & 1) +
                        piVar1[((Aig_Obj_t *)((ulong)pGate & 0xfffffffffffffffe))->Id] * 2);
    iVar2 = clock_gettime(3,&local_40);
    if (iVar2 < 0) {
      lVar4 = 1;
    }
    else {
      lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
      lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_40.tv_sec * -1000000;
    }
    iVar3 = sat_solver_solve(p->pSat,(lit *)&local_30,(lit *)&stack0xffffffffffffffd8,(long)iVar3,0,
                             0,0);
    iVar2 = clock_gettime(3,&local_40);
    if (iVar2 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    p->timeSat = p->timeSat + lVar5 + lVar4;
    if (iVar3 == 1) {
      iVar3 = clock_gettime(3,&local_40);
      if (iVar3 < 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      p->timeSatSat = p->timeSatSat + lVar5 + lVar4;
      p->nCallsSat = p->nCallsSat + 1;
      iVar3 = 0;
    }
    else if (iVar3 == -1) {
      iVar3 = clock_gettime(3,&local_40);
      if (iVar3 < 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      p->timeSatUnsat = p->timeSatUnsat + lVar5 + lVar4;
      local_30 = local_30 ^ 0x100000001;
      iVar3 = sat_solver_addclause(p->pSat,(lit *)&local_30,(lit *)&stack0xffffffffffffffd8);
      if (iVar3 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cgt/cgtSat.c"
                      ,0x48,"int Cgt_CheckImplication(Cgt_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      s = p->pSat;
      if (s->qtail != s->qhead) {
        iVar3 = sat_solver_simplify(s);
        if (iVar3 == 0) {
          __assert_fail("RetValue != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0x102,"void sat_solver_compress(sat_solver *)");
        }
      }
      p->nCallsUnsat = p->nCallsUnsat + 1;
      iVar3 = 1;
    }
    else {
      iVar3 = clock_gettime(3,&local_40);
      if (iVar3 < 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      p->timeSatUndec = p->timeSatUndec + lVar5 + lVar4;
      p->nCallsUndec = p->nCallsUndec + 1;
      iVar3 = -1;
    }
    return iVar3;
  }
  __assert_fail("Aig_Regular(pGate) != pMiter",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cgt/cgtSat.c"
                ,0x38,"int Cgt_CheckImplication(Cgt_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Runs equivalence test for the two nodes.]

  Description [Both nodes should be regular and different from each other.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Cgt_CheckImplication( Cgt_Man_t * p, Aig_Obj_t * pGate, Aig_Obj_t * pMiter )
{
    int nBTLimit = p->pPars->nConfMax;
    int pLits[2], RetValue;
    abctime clk;
    p->nCalls++;

    // sanity checks
    assert( p->pSat && p->pCnf );
    assert( !Aig_IsComplement(pMiter) );
    assert( Aig_Regular(pGate) != pMiter );

    // solve under assumptions
    // G => !M -- true     G & M -- false
    pLits[0] = toLitCond( p->pCnf->pVarNums[Aig_Regular(pGate)->Id], Aig_IsComplement(pGate) );
    pLits[1] = toLitCond( p->pCnf->pVarNums[pMiter->Id], 0 );

clk = Abc_Clock();
    RetValue = sat_solver_solve( p->pSat, pLits, pLits + 2, (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        pLits[0] = lit_neg( pLits[0] );
        pLits[1] = lit_neg( pLits[1] );
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
        sat_solver_compress( p->pSat );
        p->nCallsUnsat++;
        return 1;
    }
    else if ( RetValue == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        p->nCallsSat++;
        return 0;
    }
    else // if ( RetValue1 == l_Undef )
    {
p->timeSatUndec += Abc_Clock() - clk;
        p->nCallsUndec++;
        return -1;
    }
    return -2;
}